

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmax_distance.cpp
# Opt level: O2

double __thiscall
ProbabEstimator::getProbabLt
          (ProbabEstimator *this,double maxValInReplaced,int numReplaced,int pathLength)

{
  undefined1 auVar1 [16];
  uint k;
  DistribFunction *this_00;
  int exp;
  double base;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [64];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 extraout_var [56];
  
  this_00 = this->distribFunction;
  base = DistribFunction::getDistrib(this_00,maxValInReplaced);
  k = 0;
  dVar5 = 0.0;
  exp = pathLength;
  while ((~(numReplaced >> 0x1f) & numReplaced) != k) {
    dVar2 = combNumber((ProbabEstimator *)this_00,pathLength,k);
    dVar3 = pown((ProbabEstimator *)this_00,1.0 - base,k);
    auVar4._0_8_ = pown((ProbabEstimator *)this_00,base,exp);
    auVar4._8_56_ = extraout_var;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = dVar5;
    k = k + 1;
    exp = exp + -1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = dVar3 * dVar2;
    auVar1 = vfmadd231sd_fma(auVar6,auVar4._0_16_,auVar1);
    dVar5 = auVar1._0_8_;
  }
  return dVar5;
}

Assistant:

double ProbabEstimator::getProbabLt( const double maxValInReplaced, const int numReplaced, const int pathLength ){

    double  PAr1 = distribFunction->getDistrib( maxValInReplaced );
    double cPAr1 = 1.0-PAr1;

    double val = 0.0;
    for ( int i = 0; i < numReplaced; ++i ){
        val += (double)combNumber( pathLength, i )*pown( cPAr1, i )*pown(PAr1, (pathLength-i));
    }
    return val;
}